

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportBuildFileGenerator::SetImportLocationProperty
          (cmExportBuildFileGenerator *this,string *config,string *suffix,cmGeneratorTarget *target,
          ImportPropertyMap *properties)

{
  pointer *this_00;
  cmAlphaNum *pcVar1;
  undefined8 this_01;
  bool bVar2;
  TargetType TVar3;
  reference ppcVar4;
  mapped_type *pmVar5;
  allocator<char> local_349;
  string local_348;
  cmValue local_328;
  undefined1 local_320 [8];
  string value_1;
  cmAlphaNum local_2d0;
  undefined1 local_2a0 [8];
  string prop_2;
  string local_260;
  string local_240 [8];
  string value;
  cmAlphaNum local_1f0;
  undefined1 local_1c0 [8];
  string prop_1;
  string_view local_190;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string *local_140;
  string *obj;
  cmSourceFile *sf;
  iterator __end2;
  iterator __begin2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  string obj_dir;
  undefined1 local_d0 [8];
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  cmAlphaNum local_88;
  undefined1 local_58 [8];
  string prop;
  cmMakefile *mf;
  ImportPropertyMap *properties_local;
  cmGeneratorTarget *target_local;
  string *suffix_local;
  string *config_local;
  cmExportBuildFileGenerator *this_local;
  
  prop.field_2._8_8_ = target->Makefile;
  TVar3 = cmGeneratorTarget::GetType(target);
  if (TVar3 == OBJECT_LIBRARY) {
    cmAlphaNum::cmAlphaNum(&local_88,"IMPORTED_OBJECTS");
    this_00 = &objectSources.
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)this_00,suffix);
    cmStrCat<>((string *)local_58,&local_88,(cmAlphaNum *)this_00);
    std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
              ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_d0);
    cmGeneratorTarget::GetObjectSources
              (target,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                      local_d0,config);
    cmGeneratorTarget::GetObjectDirectory
              ((string *)
               &objects.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,target,config);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2);
    __end2 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        local_d0);
    sf = (cmSourceFile *)
         std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                   ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_d0)
    ;
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                       *)&sf), bVar2) {
      ppcVar4 = __gnu_cxx::
                __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                ::operator*(&__end2);
      obj = (string *)*ppcVar4;
      local_140 = cmGeneratorTarget::GetObjectName_abi_cxx11_(target,(cmSourceFile *)obj);
      std::operator+(&local_160,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &objects.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_140);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range2,&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      __gnu_cxx::
      __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
      ::operator++(&__end2);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_190,";");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)((long)&prop_1.field_2 + 8));
    cmJoin(&local_180,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range2,local_190,stack0xfffffffffffffe60);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,(key_type *)local_58);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
    std::__cxx11::string::~string
              ((string *)
               &objects.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
              ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_d0);
    std::__cxx11::string::~string((string *)local_58);
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_1f0,"IMPORTED_LOCATION");
    pcVar1 = (cmAlphaNum *)((long)&value.field_2 + 8);
    cmAlphaNum::cmAlphaNum(pcVar1,suffix);
    cmStrCat<>((string *)local_1c0,&local_1f0,pcVar1);
    std::__cxx11::string::string(local_240);
    bVar2 = cmGeneratorTarget::IsAppBundleOnApple(target);
    if (bVar2) {
      cmGeneratorTarget::GetFullPath(&local_260,target,config,RuntimeBinaryArtifact,false);
      std::__cxx11::string::operator=(local_240,(string *)&local_260);
      std::__cxx11::string::~string((string *)&local_260);
    }
    else {
      cmGeneratorTarget::GetFullPath
                ((string *)((long)&prop_2.field_2 + 8),target,config,RuntimeBinaryArtifact,true);
      std::__cxx11::string::operator=(local_240,(string *)(prop_2.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(prop_2.field_2._M_local_buf + 8));
    }
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,(key_type *)local_1c0);
    std::__cxx11::string::operator=((string *)pmVar5,local_240);
    std::__cxx11::string::~string(local_240);
    std::__cxx11::string::~string((string *)local_1c0);
    bVar2 = cmGeneratorTarget::HasImportLibrary(target,config);
    if (bVar2) {
      cmAlphaNum::cmAlphaNum(&local_2d0,"IMPORTED_IMPLIB");
      pcVar1 = (cmAlphaNum *)((long)&value_1.field_2 + 8);
      cmAlphaNum::cmAlphaNum(pcVar1,suffix);
      cmStrCat<>((string *)local_2a0,&local_2d0,pcVar1);
      cmGeneratorTarget::GetFullPath((string *)local_320,target,config,ImportLibraryArtifact,false);
      this_01 = prop.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_348,"CMAKE_IMPORT_LIBRARY_SUFFIX",&local_349);
      local_328 = cmMakefile::GetDefinition((cmMakefile *)this_01,&local_348);
      bVar2 = cmValue::operator_cast_to_bool(&local_328);
      std::__cxx11::string::~string((string *)&local_348);
      std::allocator<char>::~allocator(&local_349);
      if (bVar2) {
        cmGeneratorTarget::GetImplibGNUtoMS
                  (target,config,(string *)local_320,(string *)local_320,
                   "${CMAKE_IMPORT_LIBRARY_SUFFIX}");
      }
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](properties,(key_type *)local_2a0);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)local_320);
      std::__cxx11::string::~string((string *)local_320);
      std::__cxx11::string::~string((string *)local_2a0);
    }
  }
  return;
}

Assistant:

void cmExportBuildFileGenerator::SetImportLocationProperty(
  const std::string& config, std::string const& suffix,
  cmGeneratorTarget* target, ImportPropertyMap& properties)
{
  // Get the makefile in which to lookup target information.
  cmMakefile* mf = target->Makefile;

  if (target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    std::string prop = cmStrCat("IMPORTED_OBJECTS", suffix);

    // Compute all the object files inside this target and setup
    // IMPORTED_OBJECTS as a list of object files
    std::vector<cmSourceFile const*> objectSources;
    target->GetObjectSources(objectSources, config);
    std::string const obj_dir = target->GetObjectDirectory(config);
    std::vector<std::string> objects;
    for (cmSourceFile const* sf : objectSources) {
      const std::string& obj = target->GetObjectName(sf);
      objects.push_back(obj_dir + obj);
    }

    // Store the property.
    properties[prop] = cmJoin(objects, ";");
  } else {
    // Add the main target file.
    {
      std::string prop = cmStrCat("IMPORTED_LOCATION", suffix);
      std::string value;
      if (target->IsAppBundleOnApple()) {
        value =
          target->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact);
      } else {
        value = target->GetFullPath(config,
                                    cmStateEnums::RuntimeBinaryArtifact, true);
      }
      properties[prop] = value;
    }

    // Add the import library for windows DLLs.
    if (target->HasImportLibrary(config)) {
      std::string prop = cmStrCat("IMPORTED_IMPLIB", suffix);
      std::string value =
        target->GetFullPath(config, cmStateEnums::ImportLibraryArtifact);
      if (mf->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
        target->GetImplibGNUtoMS(config, value, value,
                                 "${CMAKE_IMPORT_LIBRARY_SUFFIX}");
      }
      properties[prop] = value;
    }
  }
}